

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSetupColumnFlags
               (ImGuiTable *table,ImGuiTableColumn *column,ImGuiTableColumnFlags flags_in)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  
  uVar2 = flags_in & 0x18;
  if (uVar2 == 0) {
    uVar2 = table->Flags;
    if (((short)(uVar2 & 0xe000) == 0x4000) || ((uVar2 & 0xe000) == 0x2000)) {
      flags_in = flags_in | 0x10;
    }
    else {
      flags_in = flags_in | 8;
    }
  }
  else {
    if ((uVar2 & uVar2 - 1) != 0) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                    ,0x2a0,
                    "void TableSetupColumnFlags(ImGuiTable *, ImGuiTableColumn *, ImGuiTableColumnFlags)"
                   );
    }
    uVar2 = table->Flags;
  }
  uVar3 = (~uVar2 & 1) << 5 | flags_in;
  uVar2 = uVar3 | 0x200;
  if ((~flags_in & 0xc00U) != 0) {
    uVar2 = uVar3;
  }
  if ((uVar2 & 0x30000) == 0) {
    iVar4 = ImSpan<ImGuiTableColumn>::index_from_ptr(&table->Columns,column);
    uVar2 = uVar2 + (uint)(iVar4 != 0) * 0x10000 + 0x10000;
  }
  column->Flags = column->Flags & 0xf000000U | uVar2;
  column->SortDirectionsAvailList = '\0';
  bVar1 = column->field_0x65 & 3;
  column->field_0x65 = bVar1;
  if ((table->Flags & 8U) != 0) {
    bVar9 = (uVar2 & 0x4400) == 0x4000;
    bVar5 = 8;
    if (!bVar9) {
      bVar5 = 2;
    }
    uVar8 = uVar2 & 0x8800;
    bVar7 = bVar9 * '\x02' + 4;
    uVar3 = bVar9 + 1;
    if (uVar8 != 0x8000) {
      bVar7 = bVar9 * '\x02';
      uVar3 = (uint)bVar9;
    }
    bVar6 = 0;
    if (uVar8 == 0x8000) {
      bVar6 = bVar5;
    }
    bVar6 = bVar6 | bVar9;
    if ((uVar2 & 0x4400) == 0) {
      bVar7 = bVar7 | 2;
      bVar6 = bVar6 | (byte)(1 << uVar3 * 2);
      uVar3 = uVar3 + 1;
    }
    if (uVar8 == 0) {
      bVar7 = bVar7 | 4;
      bVar6 = bVar6 | (byte)(2 << (char)uVar3 * '\x02');
      uVar3 = uVar3 + 1;
    }
    bVar5 = uVar3 == 0 | (byte)((uint)table->Flags >> 0x1b) & 1;
    column->SortDirectionsAvailList = bVar6;
    column->field_0x65 = ((char)uVar3 + bVar5) * '\x04' & 0xc | (bVar5 | bVar7) << 4 | bVar1;
    ImGui::TableFixColumnSortDirection(table,column);
    return;
  }
  return;
}

Assistant:

static void TableSetupColumnFlags(ImGuiTable* table, ImGuiTableColumn* column, ImGuiTableColumnFlags flags_in)
{
    ImGuiTableColumnFlags flags = flags_in;

    // Sizing Policy
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
    {
        const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
        if (table_sizing_policy == ImGuiTableFlags_SizingFixedFit || table_sizing_policy == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;
        else
            flags |= ImGuiTableColumnFlags_WidthStretch;
    }
    else
    {
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)); // Check that only 1 of each set is used.
    }

    // Resize
    if ((table->Flags & ImGuiTableFlags_Resizable) == 0)
        flags |= ImGuiTableColumnFlags_NoResize;

    // Sorting
    if ((flags & ImGuiTableColumnFlags_NoSortAscending) && (flags & ImGuiTableColumnFlags_NoSortDescending))
        flags |= ImGuiTableColumnFlags_NoSort;

    // Indentation
    if ((flags & ImGuiTableColumnFlags_IndentMask_) == 0)
        flags |= (table->Columns.index_from_ptr(column) == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

    // Alignment
    //if ((flags & ImGuiTableColumnFlags_AlignMask_) == 0)
    //    flags |= ImGuiTableColumnFlags_AlignCenter;
    //IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_AlignMask_)); // Check that only 1 of each set is used.

    // Preserve status flags
    column->Flags = flags | (column->Flags & ImGuiTableColumnFlags_StatusMask_);

    // Build an ordered list of available sort directions
    column->SortDirectionsAvailCount = column->SortDirectionsAvailMask = column->SortDirectionsAvailList = 0;
    if (table->Flags & ImGuiTableFlags_Sortable)
    {
        int count = 0, mask = 0, list = 0;
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  != 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) != 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  == 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) == 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((table->Flags & ImGuiTableFlags_SortTristate) || count == 0) { mask |= 1 << ImGuiSortDirection_None; count++; }
        column->SortDirectionsAvailList = (ImU8)list;
        column->SortDirectionsAvailMask = (ImU8)mask;
        column->SortDirectionsAvailCount = (ImU8)count;
        ImGui::TableFixColumnSortDirection(table, column);
    }
}